

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::assertionEnded
          (CumulativeReporterBase<Catch::JunitReporter> *this,AssertionStats *assertionStats)

{
  bool bVar1;
  __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar2;
  SectionNode *sectionNode;
  AssertionStats *assertionStats_local;
  CumulativeReporterBase<Catch::JunitReporter> *this_local;
  
  bVar1 = clara::std::
          vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
          ::empty(&this->m_sectionStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_sectionStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/unittests/catch.hpp"
                  ,0x1844,
                  "virtual bool Catch::CumulativeReporterBase<Catch::JunitReporter>::assertionEnded(const AssertionStats &) [DerivedT = Catch::JunitReporter]"
                 );
  }
  prepareExpandedExpression(&assertionStats->assertionResult);
  this_00 = (__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)clara::std::
               vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
               ::back(&this->m_sectionStack);
  peVar2 = clara::std::
           __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(this_00);
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::push_back
            (&peVar2->assertions,assertionStats);
  return true;
}

Assistant:

bool assertionEnded(AssertionStats const &assertionStats) override {
      assert(!m_sectionStack.empty());
      // AssertionResult holds a pointer to a temporary DecomposedExpression,
      // which getExpandedExpression() calls to build the expression string.
      // Our section stack copy of the assertionResult will likely outlive the
      // temporary, so it must be expanded or discarded now to avoid calling
      // a destroyed object later.
      prepareExpandedExpression(const_cast<AssertionResult &>(assertionStats.assertionResult));
      SectionNode &sectionNode = *m_sectionStack.back();
      sectionNode.assertions.push_back(assertionStats);
      return true;
    }